

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryScatterLoop<duckdb::IntervalAvgState,duckdb::interval_t,duckdb::IntervalAverageOperation>
               (interval_t *idata,AggregateInputData *aggr_input_data,IntervalAvgState **states,
               SelectionVector *isel,SelectionVector *ssel,ValidityMask *mask,idx_t count)

{
  undefined4 uVar1;
  undefined4 uVar2;
  unsigned_long *puVar3;
  IntervalAvgState *pIVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  interval_t iVar10;
  interval_t right;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar9 = 0;
      do {
        uVar7 = uVar9;
        if (isel->sel_vector != (sel_t *)0x0) {
          uVar7 = (ulong)isel->sel_vector[uVar9];
        }
        uVar8 = uVar9;
        if (ssel->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)ssel->sel_vector[uVar9];
        }
        pIVar4 = states[uVar8];
        pIVar4->count = pIVar4->count + 1;
        uVar2 = idata[uVar7].months;
        uVar6 = idata[uVar7].days;
        iVar10.days = uVar6;
        iVar10.months = uVar2;
        iVar10.micros = idata[uVar7].micros;
        iVar10 = AddOperator::Operation<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t>
                           (pIVar4->value,iVar10);
        pIVar4->value = iVar10;
        uVar9 = uVar9 + 1;
      } while (count != uVar9);
    }
  }
  else if (count != 0) {
    uVar9 = 0;
    do {
      uVar7 = uVar9;
      if (isel->sel_vector != (sel_t *)0x0) {
        uVar7 = (ulong)isel->sel_vector[uVar9];
      }
      uVar8 = uVar9;
      if (ssel->sel_vector != (sel_t *)0x0) {
        uVar8 = (ulong)ssel->sel_vector[uVar9];
      }
      puVar3 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if ((puVar3 == (unsigned_long *)0x0) || ((puVar3[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) != 0)) {
        pIVar4 = states[uVar8];
        pIVar4->count = pIVar4->count + 1;
        uVar1 = idata[uVar7].months;
        uVar5 = idata[uVar7].days;
        right.days = uVar5;
        right.months = uVar1;
        right.micros = idata[uVar7].micros;
        iVar10 = AddOperator::Operation<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t>
                           (pIVar4->value,right);
        pIVar4->value = iVar10;
      }
      uVar9 = uVar9 + 1;
    } while (count != uVar9);
  }
  return;
}

Assistant:

static inline void UnaryScatterLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                    STATE_TYPE **__restrict states, const SelectionVector &isel,
	                                    const SelectionVector &ssel, ValidityMask &mask, idx_t count) {
		if (OP::IgnoreNull() && !mask.AllValid()) {
			// potential NULL values and NULL values are ignored
			AggregateUnaryInput input(aggr_input_data, mask);
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = isel.get_index(i);
				auto sidx = ssel.get_index(i);
				if (mask.RowIsValid(input.input_idx)) {
					OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[sidx], idata[input.input_idx], input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			AggregateUnaryInput input(aggr_input_data, mask);
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = isel.get_index(i);
				auto sidx = ssel.get_index(i);
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[sidx], idata[input.input_idx], input);
			}
		}
	}